

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

bool __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::read_from_stream
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,ifstream *stream)

{
  mapped_type mVar1;
  long lVar2;
  mapped_type *pmVar3;
  bool bVar4;
  uint uVar5;
  uint val;
  uint size;
  int key;
  uint sig;
  uint _in_dims [3];
  mapped_type local_54;
  uint local_50 [2];
  _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  int local_40;
  uint local_3c [3];
  
  bVar4 = false;
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    local_40 = 0;
    local_50[0] = 0;
    std::istream::read((char *)stream,(long)&local_40);
    bVar4 = false;
    if (local_40 == 0x53534c53) {
      std::istream::read((char *)stream,(long)local_3c);
      lVar2 = 0;
      do {
        if (local_3c[lVar2] != this->_dims[lVar2]) {
          return false;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      std::istream::read((char *)stream,(long)local_50);
      local_48 = (_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->siteMap;
      std::
      _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear((_Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)local_48);
      bVar4 = true;
      if (local_50[0] != 0) {
        uVar5 = 0;
        do {
          local_50[1] = 0;
          local_54 = this->defaultValue;
          std::istream::read((char *)stream,(long)(local_50 + 1));
          std::istream::read((char *)stream,(long)&local_54);
          mVar1 = local_54;
          if (local_54 != this->defaultValue) {
            pmVar3 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_48,(key_type *)(local_50 + 1));
            *pmVar3 = mVar1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_50[0]);
      }
    }
  }
  return bVar4;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 0;

            // Check signature
            stream.read((char *)&sig, sizeof(unsigned int));
            if(sig != 0x53534c53) return false;

            // Check input dimensions
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));
            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
            }

            // Clear out the current map, and read into map
            stream.read((char *)&size, sizeof(unsigned int));
            siteMap.clear();
            for(int i = 0; i < size; ++i) {
                int key = 0;
                T val = defaultValue;

                stream.read((char *)&key, sizeof(unsigned int));
                stream.read((char *)&val, sizeof(T));

                if(val != defaultValue) {
                    siteMap[key] = val;
                }
            }
            return true;
        }